

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue promise_reaction_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSValue obj;
  JSValue v;
  JSValue JVar1;
  JSValue this_obj;
  JSValue JVar2;
  JSValue func_obj;
  JSValue v_00;
  JSValue JVar3;
  int iVar4;
  int iVar5;
  long in_RDX;
  JSContext *in_RDI;
  JSValue JVar6;
  BOOL is_reject;
  JSValue res;
  JSValue func;
  JSValue arg;
  JSValue handler;
  JSValue res2;
  JSContext *in_stack_fffffffffffffef0;
  JSContext *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  int argc_00;
  JSContext *in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  JSValueUnion in_stack_ffffffffffffff30;
  ulong in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 local_b0;
  undefined8 local_a8;
  JSValueUnion in_stack_ffffffffffffff60;
  undefined8 local_98;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_10;
  undefined8 local_8;
  
  argc_00 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  JVar1 = *(JSValue *)(in_RDX + 0x20);
  JVar6.tag._0_4_ = in_stack_ffffffffffffff10;
  JVar6.u = (JSValueUnion)in_stack_ffffffffffffff08;
  JVar6.tag._4_4_ = in_stack_ffffffffffffff14;
  iVar4 = JS_ToBool((JSContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),JVar6
                   );
  JVar2 = *(JSValue *)(in_RDX + 0x40);
  JVar6 = *(JSValue *)(in_RDX + 0x40);
  iVar5 = JS_IsUndefined(JVar1);
  if (iVar5 == 0) {
    in_stack_ffffffffffffff40 = 0;
    JVar2.tag._0_4_ = 0;
    JVar2.u = (JSValueUnion)in_stack_ffffffffffffff38;
    JVar2.tag._4_4_ = in_stack_ffffffffffffff44;
    JVar1.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
    JVar1.u.float64 = in_stack_ffffffffffffff28.float64;
    JVar6 = JS_Call(in_stack_ffffffffffffff20,JVar2,JVar1,argc_00,
                    (JSValue *)in_stack_ffffffffffffff60.ptr);
    local_b0 = JVar6.u;
    local_68 = local_b0;
    local_a8 = JVar6.tag;
    local_60 = local_a8;
  }
  else if (iVar4 == 0) {
    JVar6 = JS_DupValue(in_RDI,JVar2);
    local_68 = JVar6.u;
    local_98 = JVar6.tag;
    local_60 = local_98;
    in_stack_ffffffffffffff60 = local_68;
  }
  else {
    in_stack_fffffffffffffef8 = in_RDI;
    JS_DupValue(in_RDI,JVar6);
    obj.tag._0_4_ = in_stack_ffffffffffffff00;
    obj.u.ptr = in_stack_fffffffffffffef8;
    obj.tag._4_4_ = in_stack_ffffffffffffff04;
    JVar6 = JS_Throw(in_stack_fffffffffffffef0,obj);
    local_80 = JVar6.u;
    local_68 = local_80;
    local_78 = JVar6.tag;
    local_60 = local_78;
  }
  v_00.tag = local_60;
  v_00.u.float64 = local_68;
  iVar4 = JS_IsException(v_00);
  if (iVar4 != 0) {
    JVar6 = JS_GetException(in_RDI);
    in_stack_ffffffffffffff30 = JVar6.u;
    in_stack_ffffffffffffff38 = JVar6.tag;
  }
  iVar4 = JS_IsUndefined(*(JSValue *)(in_RDX + (long)iVar4 * 0x10));
  if (iVar4 == 0) {
    func_obj.tag._0_4_ = in_stack_ffffffffffffff40;
    func_obj.u = (JSValueUnion)in_stack_ffffffffffffff38;
    func_obj.tag._4_4_ = in_stack_ffffffffffffff44;
    this_obj.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
    this_obj.u.float64 = in_stack_ffffffffffffff28.float64;
    JVar6 = JS_Call(in_stack_ffffffffffffff20,func_obj,this_obj,0,
                    (JSValue *)in_stack_ffffffffffffff60.ptr);
    local_10 = JVar6.u;
    local_8 = JVar6.tag;
  }
  else {
    in_stack_ffffffffffffff00 = 0;
    local_10 = (void *)((ulong)in_stack_ffffffffffffff04 << 0x20);
    local_8 = 3;
  }
  v.tag._0_4_ = in_stack_ffffffffffffff00;
  v.u = (JSValueUnion)in_stack_fffffffffffffef8;
  v.tag._4_4_ = in_stack_ffffffffffffff04;
  JS_FreeValue(in_stack_fffffffffffffef0,v);
  JVar3.tag = local_8;
  JVar3.u.float64 = local_10;
  return JVar3;
}

Assistant:

static JSValue promise_reaction_job(JSContext *ctx, int argc,
                                    JSValueConst *argv)
{
    JSValueConst handler, arg, func;
    JSValue res, res2;
    BOOL is_reject;

    assert(argc == 5);
    handler = argv[2];
    is_reject = JS_ToBool(ctx, argv[3]);
    arg = argv[4];
#ifdef DUMP_PROMISE
    printf("promise_reaction_job: is_reject=%d\n", is_reject);
#endif

    if (JS_IsUndefined(handler)) {
        if (is_reject) {
            res = JS_Throw(ctx, JS_DupValue(ctx, arg));
        } else {
            res = JS_DupValue(ctx, arg);
        }
    } else {
        res = JS_Call(ctx, handler, JS_UNDEFINED, 1, &arg);
    }
    is_reject = JS_IsException(res);
    if (is_reject)
        res = JS_GetException(ctx);
    func = argv[is_reject];
    /* as an extension, we support undefined as value to avoid
       creating a dummy promise in the 'await' implementation of async
       functions */
    if (!JS_IsUndefined(func)) {
        res2 = JS_Call(ctx, func, JS_UNDEFINED,
                       1, (JSValueConst *)&res);
    } else {
        res2 = JS_UNDEFINED;
    }
    JS_FreeValue(ctx, res);

    return res2;
}